

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjIsMux(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Gia_ObjId(p,pObj);
  if (p->pMuxes == (uint *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(p->pMuxes[iVar1] != 0);
  }
  return uVar2;
}

Assistant:

static inline int          Gia_ObjIsMux( Gia_Man_t * p, Gia_Obj_t * pObj )     { return Gia_ObjIsMuxId( p, Gia_ObjId(p, pObj) ); }